

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

optional<grammar> * grammar::parse_from_file(optional<grammar> *__return_storage_ptr__,string *data)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  char cVar3;
  pointer pcVar4;
  size_type sVar5;
  _Optional_payload<grammar,_false,_false,_false> *p_Var6;
  bool bVar7;
  undefined8 *puVar8;
  bool bVar9;
  int iVar10;
  token_t tVar11;
  ostream *poVar12;
  long *plVar13;
  size_t *psVar14;
  char *pcVar15;
  optional<grammar> *poVar16;
  char *pcVar17;
  const_iterator iter;
  token_t nonterm;
  symbol_t temp_sym;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> symbol;
  anon_class_16_2_3f493c2b consume_whitespace;
  string nonterm_symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> symbol_1;
  anon_class_24_3_610413f5 consume_symbol;
  char *local_1e8;
  strong_t<int,_grammar::token_tag> local_1dc;
  char *local_1d8;
  long local_1d0;
  undefined2 local_1c8;
  undefined6 uStack_1c6;
  vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_1b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_198;
  bool local_178;
  long local_170;
  optional<grammar> *local_168;
  undefined8 *local_160;
  string *local_158;
  char *local_150;
  long local_148;
  char local_140;
  undefined7 uStack_13f;
  this_t local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  undefined1 *local_b0;
  string *local_a8;
  undefined8 **local_a0;
  undefined1 local_98 [48];
  _Rb_tree<strong_t<int,_grammar::token_tag>,_std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>,_std::_Select1st<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
  local_68;
  
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._32_8_ = (_Base_ptr)0x0;
  local_98._40_8_ = 0;
  local_98._16_8_ = (_Base_ptr)0x0;
  local_98._24_8_ = (_Base_ptr)0x0;
  local_98._0_8_ = 0;
  local_98._8_8_ = 0;
  local_168 = __return_storage_ptr__;
  grammar((grammar *)local_98);
  local_1e8 = (data->_M_dataplus)._M_p;
  local_1dc.internal_rep = 0;
  local_150 = &local_140;
  local_148 = 0;
  local_140 = '\0';
  local_a0 = &local_160;
  pcVar15 = (data->_M_dataplus)._M_p + data->_M_string_length;
  local_160 = &local_1e8;
  local_158 = data;
  local_b0 = (undefined1 *)&local_1e8;
  local_a8 = data;
  if (local_1e8 < pcVar15) {
    local_170 = 1;
    local_160 = &local_1e8;
    local_b0 = (undefined1 *)&local_1e8;
    while( true ) {
      puVar8 = local_160;
      pcVar4 = (local_158->_M_dataplus)._M_p;
      sVar5 = local_158->_M_string_length;
      pcVar17 = (char *)*local_160;
      while ((pcVar17 != pcVar4 + sVar5 && (iVar10 = isspace((int)*pcVar17), iVar10 != 0))) {
        pcVar17 = pcVar17 + 1;
        *puVar8 = pcVar17;
      }
      if (pcVar15 <= local_1e8) break;
      parse_from_file(std::__cxx11::string_const&)::$_2::operator()[abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,&local_b0);
      poVar16 = local_168;
      if ((local_178 != true) ||
         ((cVar3 = *(char *)local_198._M_value._M_dataplus._M_p, iVar10 = isupper((int)cVar3),
          cVar3 != 0x3c && (iVar10 == 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Line ",5);
        *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 2;
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Cannot use ",0xb);
        local_1d8 = (char *)CONCAT71(local_1d8._1_7_,*local_1e8);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1d8,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   " as a nonterminal\nNonterminals must either be capitalized or surrounded with <>\n"
                   ,0x50);
        (poVar16->super__Optional_base<grammar,_false,_false>)._M_payload.
        super__Optional_payload<grammar,_true,_false,_false>.super__Optional_payload_base<grammar>.
        _M_engaged = false;
        if ((local_178 == true) &&
           (local_178 = false,
           local_198._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_198._M_value + 0x10)))
        {
          operator_delete((void *)local_198._M_value._M_dataplus._M_p,local_198._16_8_ + 1);
        }
        goto LAB_00104a1b;
      }
      std::__cxx11::string::_M_assign((string *)&local_150);
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_150,local_150 + local_148)
      ;
      local_1d8 = (char *)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_f0,local_e8 + (long)local_f0);
      local_1dc.internal_rep = (int)get_nonterminal((grammar *)local_98,(symbol_t *)&local_1d8);
      if (local_1d8 != (char *)&local_1c8) {
        operator_delete(local_1d8,CONCAT62(uStack_1c6,local_1c8) + 1);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Using token ",0xc);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1dc.internal_rep);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," for nonterminal ",0x11);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_150,local_148);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if ((local_178 == true) &&
         (local_178 = false,
         local_198._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_198._M_value + 0x10))) {
        operator_delete((void *)local_198._M_value._M_dataplus._M_p,local_198._16_8_ + 1);
      }
      puVar8 = local_160;
      pcVar4 = (local_158->_M_dataplus)._M_p;
      sVar5 = local_158->_M_string_length;
      pcVar15 = (char *)*local_160;
      while ((pcVar15 != pcVar4 + sVar5 && (iVar10 = isspace((int)*pcVar15), iVar10 != 0))) {
        pcVar15 = pcVar15 + 1;
        *puVar8 = pcVar15;
      }
      pcVar15 = (data->_M_dataplus)._M_p + data->_M_string_length;
      if ((local_1e8 == pcVar15) || (*local_1e8 != '-')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Line ",5);
        *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 2;
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"Expected some hyphens after nonterminal ",0x28);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_150,local_148);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      else {
        do {
          local_1e8 = local_1e8 + 1;
          if (local_1e8 == pcVar15) break;
        } while (*local_1e8 == '-');
      }
      puVar8 = local_160;
      pcVar4 = (local_158->_M_dataplus)._M_p;
      sVar5 = local_158->_M_string_length;
      pcVar15 = (char *)*local_160;
      while ((pcVar15 != pcVar4 + sVar5 && (iVar10 = isspace((int)*pcVar15), iVar10 != 0))) {
        pcVar15 = pcVar15 + 1;
        *puVar8 = pcVar15;
      }
      local_1b8.
      super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.
      super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (strong_t<int,_grammar::token_tag> *)0x0;
      local_1b8.
      super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (strong_t<int,_grammar::token_tag> *)0x0;
      while ((local_1e8 < (data->_M_dataplus)._M_p + data->_M_string_length && (*local_1e8 != ';')))
      {
        parse_from_file(std::__cxx11::string_const&)::$_2::operator()[abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198,&local_b0);
        bVar7 = local_178;
        if (local_178 == true) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_198._M_value._M_dataplus._M_p,
                     (char *)(local_198._M_value._M_string_length +
                             (long)local_198._M_value._M_dataplus._M_p));
          local_1c8 = 0x7c;
          local_1d0 = 1;
          local_130.internal_rep._M_dataplus._M_p = (pointer)&local_130.internal_rep.field_2;
          local_1d8 = (char *)&local_1c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,&local_1c8,(long)&local_1c8 + 1);
          if (local_1d8 != (char *)&local_1c8) {
            operator_delete(local_1d8,CONCAT62(uStack_1c6,local_1c8) + 1);
          }
          bVar9 = operator==(&local_110,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130.internal_rep._M_dataplus._M_p != &local_130.internal_rep.field_2) {
            operator_delete(local_130.internal_rep._M_dataplus._M_p,
                            local_130.internal_rep.field_2._M_allocated_capacity + 1);
          }
          if (bVar9) {
            if (local_1b8.
                super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_1b8.
                super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
              ::_M_realloc_insert<strong_t<int,grammar::token_tag>const&>
                        ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                          *)&local_1b8,
                         (iterator)
                         local_1b8.
                         super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&rule_sep);
            }
            else {
              (local_1b8.
               super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->internal_rep = 0;
              local_1b8.
              super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_1b8.
                   super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_110._M_dataplus._M_p,
                       local_110._M_dataplus._M_p + local_110._M_string_length);
            local_1d8 = (char *)&local_1c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d8,local_d0,local_c8 + (long)local_d0);
            if (local_d0 != local_c0) {
              operator_delete(local_d0,local_c0[0] + 1);
            }
            cVar3 = *local_110._M_dataplus._M_p;
            iVar10 = isupper((int)cVar3);
            if ((cVar3 == 0x3c) || (iVar10 != 0)) {
              tVar11 = get_nonterminal((grammar *)local_98,(symbol_t *)&local_1d8);
              local_130.internal_rep._M_dataplus._M_p._0_4_ = tVar11.internal_rep;
              if (local_1b8.
                  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_1b8.
                  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001047b9;
              std::
              vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
              ::_M_realloc_insert<strong_t<int,grammar::token_tag>>
                        ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                          *)&local_1b8,
                         (iterator)
                         local_1b8.
                         super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (strong_t<int,_grammar::token_tag> *)&local_130);
            }
            else {
              tVar11 = get_terminal((grammar *)local_98,(symbol_t *)&local_1d8);
              local_130.internal_rep._M_dataplus._M_p._0_4_ = tVar11.internal_rep;
              if (local_1b8.
                  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_1b8.
                  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                ::_M_realloc_insert<strong_t<int,grammar::token_tag>>
                          ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                            *)&local_1b8,
                           (iterator)
                           local_1b8.
                           super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (strong_t<int,_grammar::token_tag> *)&local_130);
              }
              else {
LAB_001047b9:
                (local_1b8.
                 super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->internal_rep = tVar11.internal_rep;
                local_1b8.
                super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_1b8.
                     super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            if (local_1d8 != (char *)&local_1c8) {
              operator_delete(local_1d8,CONCAT62(uStack_1c6,local_1c8) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Line ",5);
          *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 2;
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"Could not consume next symbol in production for ",0x30);
          plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,local_1dc.internal_rep);
          std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
          std::ostream::put((char)plVar13);
          poVar12 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"Successfully parsed the following:",0x22);
          local_1d8 = (char *)&local_1c8;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_1d8,(data->_M_dataplus)._M_p,local_1e8);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_1d8,local_1d0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          if (local_1d8 != (char *)&local_1c8) {
            operator_delete(local_1d8,CONCAT62(uStack_1c6,local_1c8) + 1);
          }
          (local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
          super__Optional_payload<grammar,_true,_false,_false>.super__Optional_payload_base<grammar>
          ._M_engaged = false;
        }
        if ((local_178 == true) &&
           (local_178 = false,
           local_198._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_198._M_value + 0x10)))
        {
          operator_delete((void *)local_198._M_value._M_dataplus._M_p,local_198._16_8_ + 1);
        }
        puVar8 = local_160;
        if (bVar7 == false) {
          poVar16 = local_168;
          if (local_1b8.
              super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b8.
                            super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1b8.
                                  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1b8.
                                  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            poVar16 = local_168;
          }
          goto LAB_00104a1b;
        }
        pcVar4 = (local_158->_M_dataplus)._M_p;
        sVar5 = local_158->_M_string_length;
        pcVar15 = (char *)*local_160;
        while ((pcVar15 != pcVar4 + sVar5 && (iVar10 = isspace((int)*pcVar15), iVar10 != 0))) {
          pcVar15 = pcVar15 + 1;
          *puVar8 = pcVar15;
        }
      }
      std::
      _Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>>
      ::
      _M_emplace_unique<strong_t<int,grammar::token_tag>&,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>
                ((_Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>>
                  *)&local_68,&local_1dc,&local_1b8);
      local_1e8 = local_1e8 + 1;
      if (local_1b8.
          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.
                        super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1b8.
                              super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b8.
                              super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_170 = local_170 + 1;
      pcVar15 = (data->_M_dataplus)._M_p + data->_M_string_length;
      if (pcVar15 <= local_1e8) break;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Successfully parsed grammar\n",0x1c);
  p_Var1 = (_Base_ptr)
           ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
                   super__Optional_payload<grammar,_true,_false,_false>.
                   super__Optional_payload_base<grammar>._M_payload + 8);
  if ((_Base_ptr)local_98._16_8_ == (_Base_ptr)0x0) {
    *(undefined4 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 8) = 0;
    *(undefined8 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x10) = 0;
    *(_Base_ptr *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x18) = p_Var1;
    *(_Base_ptr *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x20) = p_Var1;
    p_Var6 = &(local_168->super__Optional_base<grammar,_false,_false>)._M_payload;
  }
  else {
    *(undefined4 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 8) = local_98._8_4_;
    *(undefined8 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x10) = local_98._16_8_;
    *(undefined8 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x18) = local_98._24_8_;
    *(undefined8 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x20) = local_98._32_8_;
    *(_Base_ptr *)(local_98._16_8_ + 8) = p_Var1;
    p_Var6 = (_Optional_payload<grammar,_false,_false,_false> *)local_98;
    *(undefined8 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x28) = local_98._40_8_;
    local_98._16_8_ = (_Base_ptr)0x0;
    local_98._24_8_ = (_Base_ptr)(local_98 + 8);
    local_98._32_8_ = (_Base_ptr)(local_98 + 8);
  }
  *(undefined8 *)
   ((long)&(p_Var6->super__Optional_payload<grammar,_true,_false,_false>).
           super__Optional_payload_base<grammar>._M_payload + 0x28) = 0;
  p_Var1 = (_Base_ptr)
           ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
                   super__Optional_payload<grammar,_true,_false,_false>.
                   super__Optional_payload_base<grammar>._M_payload + 0x38);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    *(undefined4 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x38) = 0;
    *(undefined8 *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x40) = 0;
    *(_Base_ptr *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x48) = p_Var1;
    *(_Base_ptr *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x50) = p_Var1;
    psVar14 = (size_t *)
              ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
                      super__Optional_payload<grammar,_true,_false,_false>.
                      super__Optional_payload_base<grammar>._M_payload + 0x58);
  }
  else {
    p_Var2 = &local_68._M_impl.super__Rb_tree_header;
    *(_Rb_tree_color *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x38) =
         local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    *(_Base_ptr *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x40) =
         local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Base_ptr *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x48) =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    *(_Base_ptr *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x50) =
         local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var1;
    psVar14 = &local_68._M_impl.super__Rb_tree_header._M_node_count;
    *(size_t *)
     ((long)&(local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
             super__Optional_payload<grammar,_true,_false,_false>.
             super__Optional_payload_base<grammar>._M_payload + 0x58) =
         local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  *psVar14 = 0;
  (local_168->super__Optional_base<grammar,_false,_false>)._M_payload.
  super__Optional_payload<grammar,_true,_false,_false>.super__Optional_payload_base<grammar>.
  _M_engaged = true;
  poVar16 = local_168;
LAB_00104a1b:
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  std::
  _Rb_tree<strong_t<int,_grammar::token_tag>,_std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>,_std::_Select1st<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
  ::~_Rb_tree(&local_68);
  std::
  _Rb_tree<strong_t<int,_grammar::token_tag>,_std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>,_std::_Select1st<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
  ::~_Rb_tree((_Rb_tree<strong_t<int,_grammar::token_tag>,_std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>,_std::_Select1st<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
               *)local_98);
  return poVar16;
}

Assistant:

std::optional<grammar> grammar::parse_from_file(const std::string & data) {
    grammar     to_ret{};
    auto        iter = data.begin();
    token_t     nonterm{0};
    std::string nonterm_symbol;
    size_t      line_num = 1;

    const auto consume_whitespace = [&iter, &data] {
        while (iter != data.end() and isspace(*iter)) iter++;
    };

    const auto error = [&line_num]() -> std::ostream & {
        return std::cerr << "Line " << std::setw(2) << line_num << " : ";
    };

    const auto consume_symbol
        = [&iter, &data, &consume_whitespace]() -> std::optional<std::string> {
        if (std::string symbol; iter != data.end()) {
            consume_whitespace();

            if (*iter == '<') {
                // time to eat a whole symbol
                do {
                    symbol += *iter;
                    ++iter;

                    if (*iter == '<' or *iter == ';'
                        or *iter == grammar::rule_sep or *iter == '\n') {
                        std::cerr << "Cannot use ';', '<', '|', or newline in "
                                     "a symbol "
                                     "name\nOffending name:"
                                  << symbol << std::endl;
                        return std::optional<std::string>{};
                    }
                } while (*iter != '>');

                // Append the '>'
                iter++;
                symbol += '>';
                return std::optional{symbol};
            } else {
                auto sym = *iter;
                iter++;
                return std::optional{std::string(1, sym)};
            }
        }

        std::cerr << "Unexpected end of file" << std::endl;
        return std::optional<std::string>{};
    };

    while (iter < data.end()) {
        // Remove initial whitespace
        consume_whitespace();
        if (iter >= data.end()) break;

        // Read initial symbol
        if (auto symbol = consume_symbol();
            symbol
            and (isupper(symbol.value().front())
                 or symbol.value().front() == '<')) {
            nonterm_symbol = symbol.value();
            nonterm        = to_ret.get_nonterminal(symbol_t{nonterm_symbol});
            std::cout << "Using token " << nonterm << " for nonterminal "
                      << nonterm_symbol << std::endl;
        } else {
            error() << "Cannot use " << *iter
                    << " as a nonterminal\nNonterminals must either be "
                       "capitalized or surrounded with <>\n";
            return std::optional<grammar>{};
        }

        // remove whitespace between symbol and hyphen
        consume_whitespace();

        // consume all hyphens
        bool ate_hyphen = false;
        while (iter != data.end() and *iter == '-') {
            iter++;
            ate_hyphen = true;
        }
        if (not ate_hyphen) {
            error() << "Expected some hyphens after nonterminal "
                    << nonterm_symbol << std::endl;
        }

        // remove whitespace
        consume_whitespace();

        rule_t rule_list{};

        // Go to the end of the line
        // consuming the rest of the line as the rule
        while (iter < data.end() and *iter != ';') {
            if (auto sym = consume_symbol(); sym) {
                if (auto symbol = sym.value(); symbol == rule_sep_char())
                    rule_list.push_back(rule_sep);
                else if (symbol_t temp_sym{symbol};
                         isupper(symbol.front()) or symbol.front() == '<')
                    rule_list.push_back(to_ret.get_nonterminal(temp_sym));
                else
                    rule_list.push_back(to_ret.get_terminal(temp_sym));
            } else {
                error() << "Could not consume next symbol in production for "
                        << nonterm << std::endl
                        << "Successfully parsed the following:"
                        << std::string{data.begin(), iter} << std::endl;
                return std::optional<grammar>{};
            }
            consume_whitespace();
        }

        to_ret.rules.emplace(nonterm, std::move(rule_list));
        iter++;
        line_num++;
    }

    std::cout << "Successfully parsed grammar\n";
    return to_ret;
}